

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O3

Gia_Man_t * Gia_ManDupReplaceCut(Gia_Man_t *p)

{
  int iVar1;
  char *pcVar2;
  Gia_Obj_t *pGVar3;
  Gia_Obj_t *pGVar4;
  Gia_Man_t *p_00;
  size_t sVar5;
  char *pcVar6;
  Gia_Obj_t *pGVar7;
  ulong uVar8;
  Vec_Int_t *pVVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  
  Gia_ManHighLightFlopLogic(p);
  p_00 = Gia_ManStart(p->nObjs);
  pcVar2 = p->pName;
  if (pcVar2 == (char *)0x0) {
    pcVar6 = (char *)0x0;
  }
  else {
    sVar5 = strlen(pcVar2);
    pcVar6 = (char *)malloc(sVar5 + 1);
    strcpy(pcVar6,pcVar2);
  }
  p_00->pName = pcVar6;
  pcVar2 = p->pSpec;
  if (pcVar2 == (char *)0x0) {
    pcVar6 = (char *)0x0;
  }
  else {
    sVar5 = strlen(pcVar2);
    pcVar6 = (char *)malloc(sVar5 + 1);
    strcpy(pcVar6,pcVar2);
  }
  p_00->pSpec = pcVar6;
  Gia_ManFillValue(p);
  p->pObjs->Value = 0;
  if (0 < p->nObjs) {
    lVar13 = 8;
    lVar14 = 0;
    do {
      pGVar3 = p->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      uVar8 = *(ulong *)((long)pGVar3 + lVar13 + -8);
      if (((uint)uVar8 & 0xc0000000) == 0x40000000 && (uVar8 & 0x1fffffff) != 0x1fffffff) {
        iVar12 = (int)(uVar8 & 0x1fffffff);
        if (((*(byte *)((long)pGVar3 + lVar13 + (ulong)(uint)(iVar12 * 4) * -3 + -5) & 0x40) == 0)
           && (uVar10 = iVar12 << 2, *(int *)((long)pGVar3 + lVar13 + (ulong)uVar10 * -3) == -1)) {
          pGVar7 = Gia_ManAppendObj(p_00);
          uVar8 = *(ulong *)pGVar7;
          *(ulong *)pGVar7 = uVar8 | 0x9fffffff;
          *(ulong *)pGVar7 =
               uVar8 & 0xe0000000ffffffff | 0x9fffffff |
               (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
          pGVar4 = p_00->pObjs;
          if ((pGVar7 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar7)) goto LAB_001f690a;
          Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar7 - (long)pGVar4) >> 2) * -0x55555555);
          pGVar4 = p_00->pObjs;
          if ((pGVar7 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar7)) goto LAB_001f690a;
          *(int *)((long)pGVar3 + lVar13 + (ulong)uVar10 * -3) =
               (int)((ulong)((long)pGVar7 - (long)pGVar4) >> 2) * 0x55555556;
          uVar8 = *(ulong *)((long)pGVar3 + lVar13 + -8);
        }
        uVar10 = (uint)(uVar8 >> 0x20) & 0x1fffffff;
        if (((*(byte *)((long)pGVar3 + lVar13 + (ulong)(uVar10 * 4) * -3 + -5) & 0x40) == 0) &&
           (uVar10 = uVar10 << 2, *(int *)((long)pGVar3 + lVar13 + (ulong)uVar10 * -3) == -1)) {
          pGVar7 = Gia_ManAppendObj(p_00);
          uVar8 = *(ulong *)pGVar7;
          *(ulong *)pGVar7 = uVar8 | 0x9fffffff;
          *(ulong *)pGVar7 =
               uVar8 & 0xe0000000ffffffff | 0x9fffffff |
               (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
          pGVar4 = p_00->pObjs;
          if ((pGVar7 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar7)) goto LAB_001f690a;
          Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar7 - (long)pGVar4) >> 2) * -0x55555555);
          pGVar4 = p_00->pObjs;
          if ((pGVar7 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar7)) goto LAB_001f690a;
          *(int *)((long)pGVar3 + lVar13 + (ulong)uVar10 * -3) =
               (int)((ulong)((long)pGVar7 - (long)pGVar4) >> 2) * 0x55555556;
        }
      }
      lVar14 = lVar14 + 1;
      lVar13 = lVar13 + 0xc;
    } while (lVar14 < p->nObjs);
  }
  iVar12 = p->nRegs;
  if (0 < iVar12) {
    iVar11 = 0;
    do {
      iVar1 = p->vCis->nSize;
      uVar10 = (iVar1 - iVar12) + iVar11;
      if (((int)uVar10 < 0) || (iVar1 <= (int)uVar10)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar1 = p->vCis->pArray[uVar10];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_001f6929;
      pGVar3 = p->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      pGVar7 = Gia_ManAppendObj(p_00);
      uVar8 = *(ulong *)pGVar7;
      *(ulong *)pGVar7 = uVar8 | 0x9fffffff;
      *(ulong *)pGVar7 =
           uVar8 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20
      ;
      pGVar4 = p_00->pObjs;
      if ((pGVar7 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar7)) {
LAB_001f690a:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar7 - (long)pGVar4) >> 2) * -0x55555555);
      pGVar4 = p_00->pObjs;
      if ((pGVar7 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar7)) goto LAB_001f690a;
      pGVar3[iVar1].Value = (int)((ulong)((long)pGVar7 - (long)pGVar4) >> 2) * 0x55555556;
      iVar11 = iVar11 + 1;
      iVar12 = p->nRegs;
    } while (iVar11 < iVar12);
  }
  pVVar9 = p->vCos;
  if (0 < pVVar9->nSize) {
    lVar13 = 0;
    do {
      iVar12 = pVVar9->pArray[lVar13];
      if (((long)iVar12 < 0) || (p->nObjs <= iVar12)) {
LAB_001f6929:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      Gia_ManDupOrderDfs_rec(p_00,p,p->pObjs + iVar12);
      lVar13 = lVar13 + 1;
      pVVar9 = p->vCos;
    } while (lVar13 < pVVar9->nSize);
    iVar12 = p->nRegs;
  }
  Gia_ManSetRegNum(p_00,iVar12);
  Gia_ManCleanMark0(p);
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManDupReplaceCut( Gia_Man_t * p )
{
    Gia_Man_t * pNew;  int i;
    Gia_Obj_t * pObj, * pFanin;
    Gia_ManHighLightFlopLogic( p );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    // create PIs for nodes pointed to from above the cut
    Gia_ManFillValue( p );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachAnd( p, pObj, i )
    {
        if ( !pObj->fMark0 )
            continue;
        pFanin = Gia_ObjFanin0(pObj);
        if ( !pFanin->fMark0 && !~pFanin->Value )
            pFanin->Value = Gia_ManAppendCi(pNew);
        pFanin = Gia_ObjFanin1(pObj);
        if ( !pFanin->fMark0 && !~pFanin->Value )
            pFanin->Value = Gia_ManAppendCi(pNew);
    }
    // create flop outputs
    Gia_ManForEachRo( p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    // create internal nodes
    Gia_ManForEachCo( p, pObj, i )
        Gia_ManDupOrderDfs_rec( pNew, p, pObj );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    Gia_ManCleanMark0( p );
    return pNew;
}